

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplerate.c
# Opt level: O0

SRC_STATE * psrc_set_converter(int converter_type,int channels,int *error)

{
  SRC_STATE *local_28;
  SRC_STATE *state;
  int *piStack_18;
  SRC_ERROR temp_error;
  int *error_local;
  int channels_local;
  int converter_type_local;
  
  piStack_18 = error;
  error_local._0_4_ = channels;
  error_local._4_4_ = converter_type;
  switch(converter_type) {
  case 0:
    local_28 = sinc_state_new(converter_type,channels,(SRC_ERROR *)((long)&state + 4));
    break;
  case 1:
    local_28 = sinc_state_new(converter_type,channels,(SRC_ERROR *)((long)&state + 4));
    break;
  case 2:
    local_28 = sinc_state_new(converter_type,channels,(SRC_ERROR *)((long)&state + 4));
    break;
  case 3:
    local_28 = zoh_state_new(channels,(SRC_ERROR *)((long)&state + 4));
    break;
  case 4:
    local_28 = linear_state_new(channels,(SRC_ERROR *)((long)&state + 4));
    break;
  default:
    state._4_4_ = 10;
    local_28 = (SRC_STATE *)0x0;
  }
  if (piStack_18 != (int *)0x0) {
    *piStack_18 = state._4_4_;
  }
  return local_28;
}

Assistant:

static SRC_STATE *
psrc_set_converter (int converter_type, int channels, int *error)
{
	SRC_ERROR temp_error;
	SRC_STATE *state ;
	switch (converter_type)
	{
#ifdef ENABLE_SINC_BEST_CONVERTER
	case SRC_SINC_BEST_QUALITY :
		state = sinc_state_new (converter_type, channels, &temp_error) ;
		break ;
#endif
#ifdef ENABLE_SINC_MEDIUM_CONVERTER
	case SRC_SINC_MEDIUM_QUALITY :
		state = sinc_state_new (converter_type, channels, &temp_error) ;
		break ;
#endif
#ifdef ENABLE_SINC_FAST_CONVERTER
	case SRC_SINC_FASTEST :
		state = sinc_state_new (converter_type, channels, &temp_error) ;
		break ;
#endif
	case SRC_ZERO_ORDER_HOLD :
		state = zoh_state_new (channels, &temp_error) ;
		break ;
	case SRC_LINEAR :
		state = linear_state_new (channels, &temp_error) ;
		break ;
	default :
		temp_error = SRC_ERR_BAD_CONVERTER ;
		state = NULL ;
		break ;
	}

	if (error)
		*error = (int) temp_error ;

	return state ;
}